

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

string * __thiscall
llvm::APInt::toString_abi_cxx11_(string *__return_storage_ptr__,APInt *this,uint Radix,bool Signed)

{
  SmallString<40U> S;
  StringRef local_58;
  SmallVectorImpl<char> local_48;
  char local_38 [40];
  
  local_48.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_38;
  local_48.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_48.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x28;
  toString(this,&local_48,Radix,Signed,false);
  local_58.Length =
       local_48.super_SmallVectorTemplateBase<char,_true>.
       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ & 0xffffffff;
  local_58.Data =
       (char *)local_48.super_SmallVectorTemplateBase<char,_true>.
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  StringRef::str_abi_cxx11_(__return_storage_ptr__,&local_58);
  SmallVectorImpl<char>::~SmallVectorImpl(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string APInt::toString(unsigned Radix = 10, bool Signed = true) const {
  SmallString<40> S;
  toString(S, Radix, Signed, /* formatAsCLiteral = */false);
  return S.str();
}